

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator+=(TPZSFMatrix<long_double> *this,TPZMatrix<long_double> *A)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_00;
  long *in_RSI;
  TPZSFMatrix<long_double> *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  int64_t r;
  int64_t c;
  longdouble *pm;
  char *in_stack_000001b8;
  char *in_stack_000001c0;
  long local_28;
  long local_20;
  longdouble *local_18;
  
  iVar1 = (*(in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  lVar2 = (**(code **)(*in_RSI + 0x60))();
  if (CONCAT44(extraout_var,iVar1) != lVar2) {
    TPZMatrix<long_double>::Error(in_stack_000001c0,in_stack_000001b8);
  }
  local_18 = in_RDI->fElem;
  local_20 = 0;
  while( true ) {
    iVar1 = (*(in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])();
    if (CONCAT44(extraout_var_00,iVar1) <= local_20) break;
    for (local_28 = 0; local_28 <= local_20; local_28 = local_28 + 1) {
      (**(code **)(*in_RSI + 0x108))(in_RSI,local_28,local_20);
      *local_18 = *local_18 + in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      local_18 = local_18 + 1;
    }
    local_20 = local_20 + 1;
  }
  (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  return in_RDI;
}

Assistant:

TPZSFMatrix<TVar>  &
TPZSFMatrix<TVar> ::operator+=(const TPZMatrix<TVar>  &A )
{
	if (this->Dim() != A.Dim() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__,"Operator+= (TPZMatrix<>&) <different dimensions>" );
	
	TVar *pm = fElem;
	for ( int64_t c = 0; c < this->Dim(); c++ )
		for ( int64_t r = 0; r <= c; r++ )
			*pm++ += A.Get( r, c );
	
	this->fDecomposed = 0;
	return( *this );
}